

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[33]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [33])

{
  undefined4 in_register_00000014;
  String argValues [1];
  
  str<char_const(&)[33]>
            (argValues,(kj *)params,(char (*) [33])CONCAT44(in_register_00000014,severity));
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,(ArrayPtr<kj::String>)argValues[0].content._0_16_);
  Array<char>::~Array(&argValues[0].content);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}